

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

void irafswap2(char *string,int nbytes)

{
  ushort *puVar1;
  
  puVar1 = (ushort *)(string + (uint)nbytes);
  for (; string < puVar1; string = (char *)((long)string + 2)) {
    *(ushort *)string = *(ushort *)string << 8 | *(ushort *)string >> 8;
  }
  return;
}

Assistant:

static void irafswap2 (

char *string,	/* Address of starting point of bytes to swap */
int nbytes)	/* Number of bytes to swap */

{
    char *sbyte, temp, *slast;

    slast = string + nbytes;
    sbyte = string;
    while (sbyte < slast) {
	temp = sbyte[0];
	sbyte[0] = sbyte[1];
	sbyte[1] = temp;
	sbyte= sbyte + 2;
	}
    return;
}